

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O1

MergeResult
mergesort_cache_lcp_2way_parallel<false,unsigned_char>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uchar *cache_input,uchar *cache_output,size_t n)

{
  uchar *cache_output_00;
  size_t __n;
  lcp_t *lcp_output_00;
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  bool bVar4;
  MergeResult MVar5;
  MergeResult MVar6;
  uint uVar7;
  long lVar8;
  uchar *puVar9;
  ptrdiff_t _Num;
  size_t n_00;
  uint uVar10;
  uchar **ppuVar11;
  lcp_t *plVar12;
  uchar **ppuVar13;
  byte bVar14;
  size_t i_1;
  lcp_t lVar15;
  lcp_t in_R11;
  ulong uVar16;
  byte bVar17;
  
  if (0x1f < n) {
    uVar16 = n >> 1;
    MVar5 = mergesort_cache_lcp_2way_parallel<true,unsigned_char>
                      (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                       uVar16);
    puVar9 = cache_input;
    plVar12 = lcp_input;
    ppuVar13 = strings_input;
    if (MVar5 != SortedInPlace) {
      puVar9 = cache_output;
      plVar12 = lcp_output;
      ppuVar13 = strings_output;
    }
    check_input<unsigned_char>(ppuVar13,plVar12,puVar9,uVar16);
    ppuVar13 = strings_input + uVar16;
    ppuVar11 = strings_output + uVar16;
    plVar12 = lcp_input + uVar16;
    lcp_output_00 = lcp_output + uVar16;
    puVar9 = cache_input + uVar16;
    cache_output_00 = cache_output + uVar16;
    n_00 = n - uVar16;
    MVar6 = mergesort_cache_lcp_2way_parallel<true,unsigned_char>
                      (ppuVar13,ppuVar11,plVar12,lcp_output_00,puVar9,cache_output_00,n_00);
    if (MVar5 == SortedInPlace) {
      check_input<unsigned_char>(ppuVar13,plVar12,puVar9,n_00);
    }
    else {
      check_input<unsigned_char>(ppuVar11,lcp_output_00,cache_output_00,n_00);
    }
    if (MVar5 != MVar6) {
      __n = uVar16 * 8;
      if (MVar5 == SortedInPlace) {
        memmove(strings_output,strings_input,__n);
        memcpy(cache_output,cache_input,uVar16);
        memcpy(lcp_output,lcp_input,__n);
        MVar5 = SortedInTemp;
      }
      else {
        memmove(strings_input,strings_output,__n);
        memcpy(cache_input,cache_output,uVar16);
        memcpy(lcp_input,lcp_output,__n);
        MVar6 = SortedInTemp;
      }
    }
    if (MVar5 == MVar6) {
      if (MVar5 != SortedInPlace) {
        merge_cache_lcp_2way<false,unsigned_char>
                  (strings_output,lcp_output,cache_output,uVar16,ppuVar11,lcp_output_00,
                   cache_output_00,n_00,strings_input,lcp_input,cache_input);
        return SortedInPlace;
      }
      merge_cache_lcp_2way<false,unsigned_char>
                (strings_input,lcp_input,cache_input,uVar16,ppuVar13,plVar12,puVar9,n_00,
                 strings_output,lcp_output,cache_output);
      return SortedInTemp;
    }
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x5e2,
                  "MergeResult mergesort_cache_lcp_2way_parallel(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = false, CharT = unsigned char]"
                 );
  }
  ppuVar13 = strings_input;
  if (1 < (long)n) {
    uVar16 = n & 0xffffffff;
    ppuVar11 = strings_input;
    do {
      iVar3 = (int)uVar16;
      uVar16 = (ulong)(iVar3 - 1);
      pbVar1 = ppuVar11[1];
      ppuVar11 = ppuVar11 + 1;
      for (ppuVar13 = ppuVar11; strings_input < ppuVar13; ppuVar13 = ppuVar13 + -1) {
        pbVar2 = ppuVar13[-1];
        bVar17 = *pbVar2;
        bVar14 = *pbVar1;
        in_R11 = CONCAT71((int7)(in_R11 >> 8),bVar17 != bVar14);
        if (bVar17 != 0 && bVar17 == bVar14) {
          in_R11 = 1;
          do {
            bVar17 = pbVar2[in_R11];
            bVar14 = pbVar1[in_R11];
            if (bVar17 == 0) break;
            in_R11 = in_R11 + 1;
          } while (bVar17 == bVar14);
        }
        if (bVar17 <= bVar14) break;
        *ppuVar13 = pbVar2;
      }
      *ppuVar13 = pbVar1;
    } while (2 < iVar3);
  }
  puVar9 = *strings_input;
  lVar8 = 0;
  ppuVar11 = (uchar **)0x0;
  do {
    if ((puVar9[lVar8] == '\0') || (puVar9[lVar8] != strings_input[1][lVar8])) {
      bVar4 = false;
      ppuVar13 = ppuVar11;
    }
    else {
      ppuVar11 = (uchar **)((long)ppuVar11 + 1);
      bVar4 = true;
    }
    lVar8 = lVar8 + 1;
  } while (bVar4);
  *lcp_input = (lcp_t)ppuVar13;
  if (puVar9 != (uchar *)0x0) {
    *cache_input = *puVar9;
    if (1 < n - 1) {
      uVar16 = 1;
      uVar7 = 1;
      do {
        puVar9 = strings_input[uVar16];
        uVar10 = uVar7 + 1;
        lVar8 = 0;
        lVar15 = 0;
        do {
          if ((puVar9[lVar8] == '\0') || (puVar9[lVar8] != strings_input[uVar10][lVar8])) {
            bVar4 = false;
            in_R11 = lVar15;
          }
          else {
            lVar15 = lVar15 + 1;
            bVar4 = true;
          }
          lVar8 = lVar8 + 1;
        } while (bVar4);
        lcp_input[uVar16] = in_R11;
        if (puVar9 == (uchar *)0x0) goto LAB_001d21ea;
        cache_input[uVar16] = puVar9[lcp_input[uVar7 - 1]];
        uVar16 = (ulong)uVar10;
        uVar7 = uVar10;
      } while (uVar16 < n - 1);
    }
    if (strings_input[n - 1] != (uchar *)0x0) {
      cache_input[n - 1] = strings_input[n - 1][lcp_input[n - 2]];
      check_input<unsigned_char>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
  }
LAB_001d21ea:
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x26,"unsigned char get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way_parallel(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0, m1;
	m0 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	m1 = mergesort_cache_lcp_2way_parallel<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}